

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O1

void __thiscall Minisat::Solver::setDecisionVar(Solver *this,Var v,bool b)

{
  long lVar1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,b) == 0) {
LAB_0010d953:
    if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= v)
    goto LAB_0010d9c9;
    lVar1 = -1;
    if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[v] != '\0')
    {
LAB_0010d977:
      this->dec_vars = this->dec_vars + lVar1;
    }
  }
  else {
    if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= v)
    goto LAB_0010d9c9;
    if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[v] == '\0')
    {
      lVar1 = 1;
      goto LAB_0010d977;
    }
    if (!b) goto LAB_0010d953;
  }
  if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= v) {
LAB_0010d9c9:
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                  ,0x28,
                  "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
                 );
  }
  (this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[v] = b;
  if (((this->order_heap).indices.map.sz <= v) || ((this->order_heap).indices.map.data[v] < 0)) {
    if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= v)
    goto LAB_0010d9c9;
    if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[v] != '\0')
    {
      Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::insert
                (&this->order_heap,v);
      return;
    }
  }
  return;
}

Assistant:

inline void     Solver::setDecisionVar(Var v, bool b) 
{ 
    if      ( b && !decision[v]) dec_vars++;
    else if (!b &&  decision[v]) dec_vars--;

    decision[v] = b;
    insertVarOrder(v);
}